

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O3

QMetaMethodBuilder __thiscall
QMetaObjectBuilder::addMethod(QMetaObjectBuilder *this,QMetaMethod *prototype)

{
  undefined1 auVar1 [12];
  bool bVar2;
  MethodType MVar3;
  uint uVar4;
  int iVar5;
  char *data;
  QMetaMethodBuilderPrivate *pQVar6;
  QArrayDataPointer<QByteArray> *other;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  long in_FS_OFFSET;
  QMetaMethodBuilder QVar7;
  QArrayDataPointer<QByteArray> local_50;
  QMetaMethodBuilder local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._12_4_ = 0xaaaaaaaa;
  local_38._mobj = (QMetaObjectBuilder *)0x0;
  local_38._index = 0;
  MVar3 = QMetaMethod::methodType(prototype);
  if (MVar3 == Method) {
    QMetaMethod::methodSignature((QByteArray *)&local_50,prototype);
    QVar7 = addMethod(this,(QByteArray *)&local_50);
    auVar1 = QVar7._0_12_;
  }
  else {
    MVar3 = QMetaMethod::methodType(prototype);
    if (MVar3 == Signal) {
      QMetaMethod::methodSignature((QByteArray *)&local_50,prototype);
      QVar7 = addSignal(this,(QByteArray *)&local_50);
      auVar1 = QVar7._0_12_;
    }
    else {
      MVar3 = QMetaMethod::methodType(prototype);
      if (MVar3 == Slot) {
        QMetaMethod::methodSignature((QByteArray *)&local_50,prototype);
        QVar7 = addSlot(this,(QByteArray *)&local_50);
        auVar1 = QVar7._0_12_;
      }
      else {
        MVar3 = QMetaMethod::methodType(prototype);
        if (MVar3 != Constructor) goto LAB_002878a3;
        QMetaMethod::methodSignature((QByteArray *)&local_50,prototype);
        QVar7 = addConstructor(this,(QByteArray *)&local_50);
        auVar1 = QVar7._0_12_;
      }
    }
  }
  local_38._mobj = auVar1._0_8_;
  local_38._index = auVar1._8_4_;
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d)->super_QArrayData,1,0x10);
    }
  }
LAB_002878a3:
  data = QMetaMethod::typeName(prototype);
  QByteArray::QByteArray((QByteArray *)&local_50,data,-1);
  QMetaMethodBuilder::setReturnType(&local_38,(QByteArray *)&local_50);
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d)->super_QArrayData,1,0x10);
    }
  }
  QMetaMethod::parameterNames((QList<QByteArray> *)&local_50,prototype);
  pQVar6 = QMetaMethodBuilder::d_func(&local_38);
  if (pQVar6 != (QMetaMethodBuilderPrivate *)0x0) {
    QArrayDataPointer<QByteArray>::operator=(&(pQVar6->parameterNames).d,&local_50);
  }
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_50);
  other = (QArrayDataPointer<QByteArray> *)QMetaMethod::tag(prototype);
  QByteArray::QByteArray((QByteArray *)&local_50,(char *)other,-1);
  pQVar6 = QMetaMethodBuilder::d_func(&local_38);
  iVar5 = extraout_EDX;
  if (pQVar6 != (QMetaMethodBuilderPrivate *)0x0) {
    other = &local_50;
    QByteArray::operator=(&pQVar6->tag,(QByteArray *)other);
    iVar5 = extraout_EDX_00;
  }
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      other = (QArrayDataPointer<QByteArray> *)0x1;
      QArrayData::deallocate(&(local_50.d)->super_QArrayData,1,0x10);
      iVar5 = extraout_EDX_01;
    }
  }
  uVar4 = QMetaMethod::access(prototype,(char *)other,iVar5);
  pQVar6 = QMetaMethodBuilder::d_func(&local_38);
  if ((pQVar6 != (QMetaMethodBuilderPrivate *)0x0) && ((pQVar6->attributes & 0xcU) != 4)) {
    pQVar6->attributes = pQVar6->attributes & 0xfffffffcU | uVar4;
  }
  uVar4 = QMetaMethod::attributes(prototype);
  pQVar6 = QMetaMethodBuilder::d_func(&local_38);
  if (pQVar6 != (QMetaMethodBuilderPrivate *)0x0) {
    pQVar6->attributes = (uVar4 & 7) << 4 | pQVar6->attributes & 0xffffff8fU;
  }
  iVar5 = QMetaMethod::revision(prototype);
  pQVar6 = QMetaMethodBuilder::d_func(&local_38);
  if (pQVar6 != (QMetaMethodBuilderPrivate *)0x0) {
    pQVar6->revision = iVar5;
    pQVar6->attributes = (uint)(iVar5 != 0) << 7 | pQVar6->attributes & 0xffffff7fU;
  }
  bVar2 = QMetaMethod::isConst(prototype);
  pQVar6 = QMetaMethodBuilder::d_func(&local_38);
  if (pQVar6 != (QMetaMethodBuilderPrivate *)0x0) {
    pQVar6->attributes = (uint)bVar2 << 8 | pQVar6->attributes & 0xfffffeffU;
  }
  QVar7._index = local_38._index;
  QVar7._mobj = local_38._mobj;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    QVar7._12_4_ = 0;
    return QVar7;
  }
  __stack_chk_fail();
}

Assistant:

QMetaMethodBuilder QMetaObjectBuilder::addMethod(const QMetaMethod &prototype)
{
    QMetaMethodBuilder method;
    if (prototype.methodType() == QMetaMethod::Method)
        method = addMethod(prototype.methodSignature());
    else if (prototype.methodType() == QMetaMethod::Signal)
        method = addSignal(prototype.methodSignature());
    else if (prototype.methodType() == QMetaMethod::Slot)
        method = addSlot(prototype.methodSignature());
    else if (prototype.methodType() == QMetaMethod::Constructor)
        method = addConstructor(prototype.methodSignature());
    method.setReturnType(prototype.typeName());
    method.setParameterNames(prototype.parameterNames());
    method.setTag(prototype.tag());
    method.setAccess(prototype.access());
    method.setAttributes(prototype.attributes());
    method.setRevision(prototype.revision());
    method.setConst(prototype.isConst());
    return method;
}